

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateFromDeviceAuth
          (char *iothub_uri,char *device_id,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  LOGGER_LOG p_Var1;
  IOTHUB_CLIENT_CONFIG *client_config;
  size_t sVar2;
  bool bVar3;
  size_t local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  size_t local_b8;
  ulong local_b0;
  LOGGER_LOG l_5;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t calloc_size;
  size_t length;
  char *iothub_suffix;
  char *iothub_name;
  char *initial;
  char *iterator;
  LOGGER_LOG l_1;
  IOTHUB_CLIENT_CONFIG *config;
  LOGGER_LOG l;
  IOTHUB_CLIENT_CORE_LL_HANDLE result;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol_local;
  char *device_id_local;
  char *iothub_uri_local;
  
  if (((iothub_uri == (char *)0x0) || (protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) ||
     (device_id == (char *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x508,1,
                "Input parameter is NULL: iothub_uri: %p  protocol: %p device_id: %p",iothub_uri,
                protocol,device_id);
    }
  }
  else {
    client_config = (IOTHUB_CLIENT_CONFIG *)malloc(0x38);
    if (client_config != (IOTHUB_CLIENT_CONFIG *)0x0) {
      iothub_suffix = (char *)0x0;
      length = 0;
      memset(client_config,0,0x38);
      client_config->protocol = protocol;
      client_config->deviceId = device_id;
      initial = iothub_uri;
      do {
        bVar3 = false;
        if (initial != (char *)0x0) {
          bVar3 = *initial != '\0';
        }
        if (!bVar3) goto LAB_001202d6;
        if (*initial == '.') {
          if (initial < iothub_uri) {
            local_b0 = 0xffffffffffffffff;
          }
          else {
            local_b0 = (long)initial - (long)iothub_uri;
          }
          if (local_b0 < 0xfffffffffffffffe) {
            local_b8 = local_b0 + 1;
          }
          else {
            local_b8 = 0xffffffffffffffff;
          }
          if ((local_b8 == 0xffffffffffffffff) ||
             (iothub_suffix = (char *)calloc(1,local_b8), iothub_suffix == (char *)0x0)) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x540,1,
                        "Failed to allocate iothub name, size:%zu",local_b8);
            }
          }
          else {
            memcpy(iothub_suffix,iothub_uri,local_b0);
            client_config->iotHubName = iothub_suffix;
            sVar2 = strlen(iothub_uri);
            if (sVar2 < local_b0) {
              local_c0 = -1;
            }
            else {
              sVar2 = strlen(iothub_uri);
              local_c0 = sVar2 - local_b0;
            }
            if (local_c0 == 0) {
              local_d0 = 0xffffffffffffffff;
            }
            else {
              sVar2 = strlen(iothub_uri);
              if (sVar2 < local_b0) {
                local_c8 = -1;
              }
              else {
                sVar2 = strlen(iothub_uri);
                local_c8 = sVar2 - local_b0;
              }
              local_d0 = local_c8 - 1;
            }
            if (local_d0 < 0xfffffffffffffffe) {
              local_d8 = local_d0 + 1;
            }
            else {
              local_d8 = 0xffffffffffffffff;
            }
            if ((local_d8 != 0xffffffffffffffff) &&
               (length = (size_t)calloc(1,local_d8), (char *)length != (char *)0x0)) {
              memcpy((void *)length,initial + 1,local_d0);
              client_config->iotHubSuffix = (char *)length;
LAB_001202d6:
              if ((client_config->iotHubName == (char *)0x0) ||
                 (client_config->iotHubSuffix == (char *)0x0)) {
                p_Var1 = xlogging_get_log_function();
                if (p_Var1 != (LOGGER_LOG)0x0) {
                  (*p_Var1)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x549,1,
                            "initialize iothub client");
                }
                l = (LOGGER_LOG)0x0;
              }
              else {
                l = (LOGGER_LOG)
                    initialize_iothub_client
                              (client_config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,true,(char *)0x0);
                if ((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l ==
                    (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
                  p_Var1 = xlogging_get_log_function();
                  if (p_Var1 != (LOGGER_LOG)0x0) {
                    (*p_Var1)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                              ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x551,1,
                              "initialize iothub client");
                  }
                  l = (LOGGER_LOG)0x0;
                }
              }
              free(iothub_suffix);
              free((void *)length);
              free(client_config);
              return (IOTHUB_CLIENT_CORE_LL_HANDLE)l;
            }
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x538,1,
                        "Failed to allocate iothub suffix, size:%zu",local_d8);
            }
            free(iothub_suffix);
            iothub_suffix = (char *)0x0;
          }
        }
        initial = initial + 1;
      } while( true );
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x511,1,"Malloc failed");
    }
  }
  return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateFromDeviceAuth(const char* iothub_uri, const char* device_id, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;
    if (iothub_uri == NULL || protocol == NULL || device_id == NULL)
    {
        LogError("Input parameter is NULL: iothub_uri: %p  protocol: %p device_id: %p", iothub_uri, protocol, device_id);
        result = NULL;
    }
    else
    {
#ifdef USE_PROV_MODULE
        IOTHUB_CLIENT_CONFIG* config = (IOTHUB_CLIENT_CONFIG*)malloc(sizeof(IOTHUB_CLIENT_CONFIG));
        if (config == NULL)
        {
            LogError("Malloc failed");
            result = NULL;
        }
        else
        {
            const char* iterator;
            const char* initial;
            char* iothub_name = NULL;
            char* iothub_suffix = NULL;

            memset(config, 0, sizeof(IOTHUB_CLIENT_CONFIG));
            config->protocol = protocol;
            config->deviceId = device_id;

            // Find the iothub suffix
            initial = iterator = iothub_uri;
            while (iterator != NULL && *iterator != '\0')
            {
                if (*iterator == '.')
                {
                    size_t length = safe_subtract_size_t(iterator, initial);
                    size_t calloc_size = safe_add_size_t(length, 1);
                    if (calloc_size != SIZE_MAX &&
                        (iothub_name = (char*)calloc(1, calloc_size)) != NULL)
                    {
                        memcpy(iothub_name, initial, length);
                        config->iotHubName = iothub_name;

                        length = safe_subtract_size_t(safe_subtract_size_t(strlen(initial), length), 1);
                        calloc_size = safe_add_size_t(length, 1);
                        if (calloc_size != SIZE_MAX &&
                            (iothub_suffix = (char*)calloc(1, calloc_size)) != NULL)
                        {
                            memcpy(iothub_suffix, iterator + 1, length);
                            config->iotHubSuffix = iothub_suffix;
                            break;
                        }
                        else
                        {
                            LogError("Failed to allocate iothub suffix, size:%zu", calloc_size);
                            free(iothub_name);
                            iothub_name = NULL;
                            result = NULL;
                        }
                    }
                    else
                    {
                        LogError("Failed to allocate iothub name, size:%zu", calloc_size);
                        result = NULL;
                    }
                }
                iterator++;
            }

            if (config->iotHubName == NULL || config->iotHubSuffix == NULL)
            {
                LogError("initialize iothub client");
                result = NULL;
            }
            else
            {
                IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = initialize_iothub_client(config, NULL, true, NULL);
                if (handleData == NULL)
                {
                    LogError("initialize iothub client");
                    result = NULL;
                }
                else
                {
                    result = handleData;
                }
            }

            free(iothub_name);
            free(iothub_suffix);
            free(config);
        }
#else
        LogError("HSM module is not included");
        result = NULL;
#endif
    }
    return result;
}